

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidgetitemiterator.cpp
# Opt level: O2

void __thiscall
QTreeWidgetItemIterator::QTreeWidgetItemIterator
          (QTreeWidgetItemIterator *this,QTreeWidget *widget,IteratorFlags flags)

{
  bool bVar1;
  QAbstractItemModel *object;
  QTreeModel *pQVar2;
  QTreeWidgetItemIteratorPrivate *other;
  QTreeWidgetItem *item;
  
  (this->d_ptr).d = (QTreeWidgetItemIteratorPrivate *)0x0;
  this->current = (QTreeWidgetItem *)0x0;
  (this->flags).super_QFlagsStorageHelper<QTreeWidgetItemIterator::IteratorFlag,_4>.
  super_QFlagsStorage<QTreeWidgetItemIterator::IteratorFlag>.i =
       (Int)flags.super_QFlagsStorageHelper<QTreeWidgetItemIterator::IteratorFlag,_4>.
            super_QFlagsStorage<QTreeWidgetItemIterator::IteratorFlag>.i;
  object = QAbstractItemView::model((QAbstractItemView *)widget);
  pQVar2 = QtPrivate::qobject_cast_helper<QTreeModel*,QObject>((QObject *)object);
  other = (QTreeWidgetItemIteratorPrivate *)operator_new(0x30);
  other->m_currentIndex = 0;
  other->m_model = pQVar2;
  (other->m_parentIndex).super_QList<int>.d.d = (Data *)0x0;
  (other->m_parentIndex).super_QList<int>.d.ptr = (int *)0x0;
  (other->m_parentIndex).super_QList<int>.d.size = 0;
  other->q_ptr = this;
  QScopedPointer<QTreeWidgetItemIteratorPrivate,_QScopedPointerDeleter<QTreeWidgetItemIteratorPrivate>_>
  ::reset(&this->d_ptr,other);
  QList<QTreeWidgetItemIterator_*>::append(&pQVar2->iterators,this);
  if ((pQVar2->rootItem->children).d.size == 0) {
    item = this->current;
  }
  else {
    item = QTreeWidgetItem::child(pQVar2->rootItem,0);
    this->current = item;
  }
  if (item != (QTreeWidgetItem *)0x0) {
    bVar1 = matchesFlags(this,item);
    if (!bVar1) {
      operator++(this);
      return;
    }
  }
  return;
}

Assistant:

QTreeWidgetItemIterator::QTreeWidgetItemIterator(QTreeWidget *widget, IteratorFlags flags)
: current(nullptr), flags(flags)
{
    Q_ASSERT(widget);
    QTreeModel *model = qobject_cast<QTreeModel*>(widget->model());
    Q_ASSERT(model);
    d_ptr.reset(new QTreeWidgetItemIteratorPrivate(this, model));
    model->iterators.append(this);
    if (!model->rootItem->children.isEmpty()) current = model->rootItem->child(0);
    if (current && !matchesFlags(current))
        ++(*this);
}